

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O1

void ly_load_plugins_dir(DIR *dir,char *dir_path,int ext_or_type)

{
  int iVar1;
  int iVar2;
  dirent *pdVar3;
  size_t sVar4;
  void *node;
  undefined8 uVar5;
  char *pcVar6;
  lytype_plugin_list *plugin;
  long lVar7;
  int *piVar8;
  char **ppcVar9;
  ushort uVar10;
  char *pcVar11;
  char *local_38;
  char *str;
  
  pdVar3 = readdir((DIR *)dir);
  do {
    if (pdVar3 == (dirent *)0x0) {
      return;
    }
    pcVar6 = pdVar3->d_name;
    sVar4 = strlen(pcVar6);
    if ((3 < sVar4) && (iVar1 = strcmp(pcVar6 + (sVar4 - 3),".so"), iVar1 == 0)) {
      iVar1 = asprintf(&local_38,"%s/%s",dir_path,pcVar6);
      if (iVar1 == -1) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "ly_load_plugins_dir");
        return;
      }
      node = (void *)dlopen();
      pcVar11 = local_38;
      if (node == (void *)0x0) {
        uVar5 = dlerror();
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Loading \"%s\" as a plugin failed (%s).",pcVar11,
               uVar5);
        free(local_38);
      }
      else {
        iVar1 = ly_set_contains(&dlhandlers,node);
        if (iVar1 == -1) {
          dlerror();
          pcVar6 = strndup(pcVar6,sVar4 - 3);
          if (pcVar6 == (char *)0x0) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "ly_load_plugins_dir");
            dlclose(node);
            free(local_38);
            return;
          }
          plugin = (lytype_plugin_list *)dlsym();
          lVar7 = dlerror();
          if (ext_or_type == 0) {
            if (lVar7 != 0) {
              pcVar11 = 
              "Processing \"%s\" user type plugin failed, missing plugin list object (%s).";
              goto LAB_00172cef;
            }
            piVar8 = (int *)dlsym(node,"lytype_api_version");
            lVar7 = dlerror();
            if ((lVar7 != 0) || (*piVar8 != 1)) {
              if (piVar8 == (int *)0x0) {
                iVar1 = 0;
              }
              else {
                iVar1 = *piVar8;
              }
              pcVar11 = 
              "Processing \"%s\" user type plugin failed, wrong API version - %d expected, %d found."
              ;
              goto LAB_00172dbe;
            }
            iVar2 = ly_register_types(plugin,pcVar6);
          }
          else if (lVar7 == 0) {
            piVar8 = (int *)dlsym(node,"lyext_api_version");
            lVar7 = dlerror();
            if ((lVar7 == 0) && (*piVar8 == 1)) {
              iVar2 = ly_register_exts((lyext_plugin_list *)plugin,pcVar6);
            }
            else {
              if (piVar8 == (int *)0x0) {
                iVar1 = 0;
              }
              else {
                iVar1 = *piVar8;
              }
              pcVar11 = 
              "Processing \"%s\" extension plugin failed, wrong API version - %d expected, %d found."
              ;
LAB_00172dbe:
              iVar2 = 1;
              ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,pcVar11,pcVar6,1,iVar1);
            }
          }
          else {
            pcVar11 = "Processing \"%s\" extension plugin failed, missing plugin list object (%s).";
LAB_00172cef:
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,pcVar11,pcVar6,lVar7);
            iVar2 = 1;
          }
          if (iVar2 == 0) {
            ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Plugin \"%s\" successfully loaded.",local_38);
            ppcVar9 = (char **)ly_realloc(loaded_plugins,(ulong)loaded_plugins_count * 8 + 0x10);
            loaded_plugins = ppcVar9;
            if (ppcVar9 == (char **)0x0) {
              free(pcVar6);
              ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "ly_add_loaded_plugin");
            }
            else {
              uVar10 = loaded_plugins_count + 1;
              loaded_plugins_count = uVar10;
              ppcVar9[(ulong)uVar10 - 1] = pcVar6;
              ppcVar9[uVar10] = (char *)0x0;
            }
            ly_set_add(&dlhandlers,node,1);
          }
          else {
            free(pcVar6);
            dlclose(node);
          }
          free(local_38);
          if (iVar2 == -1) {
            return;
          }
        }
        else {
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Plugin \"%s\" already loaded.",local_38);
          free(local_38);
          dlclose(node);
        }
      }
    }
    pdVar3 = readdir((DIR *)dir);
  } while( true );
}

Assistant:

static void
ly_load_plugins_dir(DIR *dir, const char *dir_path, int ext_or_type)
{
    struct dirent *file;
    size_t len;
    char *str, *name;
    void *dlhandler;
    int ret;

#ifdef STATIC
    return;
#endif /* STATIC */

    while ((file = readdir(dir))) {
        /* required format of the filename is *LY_PLUGIN_SUFFIX */
        len = strlen(file->d_name);
        if (len < LY_PLUGIN_SUFFIX_LEN + 1 ||
                strcmp(&file->d_name[len - LY_PLUGIN_SUFFIX_LEN], LY_PLUGIN_SUFFIX)) {
            continue;
        }

        /* and construct the filepath */
        if (asprintf(&str, "%s/%s", dir_path, file->d_name) == -1) {
            LOGMEM(NULL);
            return;
        }

        /* load the plugin */
        dlhandler = dlopen(str, RTLD_NOW);
        if (!dlhandler) {
            LOGERR(NULL, LY_ESYS, "Loading \"%s\" as a plugin failed (%s).", str, dlerror());
            free(str);
            continue;
        }
        if (ly_set_contains(&dlhandlers, dlhandler) != -1) {
            /* the plugin is already loaded */
            LOGVRB("Plugin \"%s\" already loaded.", str);
            free(str);

            /* keep the refcount of the shared object correct */
            dlclose(dlhandler);
            continue;
        }
        dlerror();    /* Clear any existing error */

        /* store the name without the suffix */
        name = strndup(file->d_name, len - LY_PLUGIN_SUFFIX_LEN);
        if (!name) {
            LOGMEM(NULL);
            dlclose(dlhandler);
            free(str);
            return;
        }

        if (ext_or_type) {
            ret = lyext_load_plugin(dlhandler, name);
        } else {
            ret = lytype_load_plugin(dlhandler, name);
        }
        if (!ret) {
            LOGVRB("Plugin \"%s\" successfully loaded.", str);
            /* spends name */
            ly_add_loaded_plugin(name);
            /* keep the handler */
            ly_set_add(&dlhandlers, dlhandler, LY_SET_OPT_USEASLIST);
        } else {
            free(name);
            dlclose(dlhandler);
        }
        free(str);

        if (ret == -1) {
            /* finish on error */
            break;
        }
    }
}